

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# SecondaryOperationalData.cpp
# Opt level: O1

KString * __thiscall
KDIS::DATA_TYPE::SecondaryOperationalData::GetAsString_abi_cxx11_
          (KString *__return_storage_ptr__,SecondaryOperationalData *this)

{
  ostream *poVar1;
  KStringStream ss;
  stringstream local_1a0 [16];
  ostream local_190 [112];
  ios_base local_120 [264];
  
  std::__cxx11::stringstream::stringstream(local_1a0);
  std::__ostream_insert<char,std::char_traits<char>>(local_190,"SecondaryOperationalData:",0x19);
  std::__ostream_insert<char,std::char_traits<char>>
            (local_190,"\n\tParameter 1:                   ",0x21);
  poVar1 = std::ostream::_M_insert<unsigned_long>((ulong)local_190);
  std::__ostream_insert<char,std::char_traits<char>>
            (poVar1,"\n\tParameter 2:                   ",0x21);
  poVar1 = std::ostream::_M_insert<unsigned_long>((ulong)poVar1);
  std::__ostream_insert<char,std::char_traits<char>>
            (poVar1,"\n\tNumber Fundamental Param Sets: ",0x21);
  poVar1 = std::ostream::_M_insert<unsigned_long>((ulong)poVar1);
  std::__ostream_insert<char,std::char_traits<char>>(poVar1,"\n",1);
  std::__cxx11::stringbuf::str();
  std::__cxx11::stringstream::~stringstream(local_1a0);
  std::ios_base::~ios_base(local_120);
  return __return_storage_ptr__;
}

Assistant:

KString SecondaryOperationalData::GetAsString() const
{
    KStringStream ss;

    ss << "SecondaryOperationalData:"
       << "\n\tParameter 1:                   " << ( KUINT16 )m_ui8Param1
       << "\n\tParameter 2:                   " << ( KUINT16 )m_ui8Param2
       << "\n\tNumber Fundamental Param Sets: " << m_ui16NumFundParamSets
       << "\n";

    return ss.str();
}